

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDAttDefList.cpp
# Opt level: O0

XMLAttDef * __thiscall
xercesc_4_0::DTDAttDefList::findAttDef(DTDAttDefList *this,XMLCh *param_1,XMLCh *attName)

{
  DTDAttDef *pDVar1;
  XMLCh *attName_local;
  XMLCh *param_1_local;
  DTDAttDefList *this_local;
  
  pDVar1 = RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher>::get
                     (this->fList,attName);
  return &pDVar1->super_XMLAttDef;
}

Assistant:

XMLAttDef* DTDAttDefList::findAttDef(   const   XMLCh* const
                                        , const XMLCh* const    attName)
{
    // We don't use the URI, so we just look up the name
    return fList->get(attName);
}